

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

void Extra_ThreshSortByChow(word *t,int nVars,int *pChow)

{
  int iVar1;
  bool bVar2;
  int nWords_00;
  int t_1;
  int fChange;
  int nWords;
  int i;
  int *pChow_local;
  int nVars_local;
  word *t_local;
  
  nWords_00 = Abc_TtWordNum(nVars);
  do {
    bVar2 = false;
    for (fChange = 0; fChange < nVars + -1; fChange = fChange + 1) {
      if (pChow[fChange] < pChow[fChange + 1]) {
        iVar1 = pChow[fChange];
        pChow[fChange] = pChow[fChange + 1];
        pChow[fChange + 1] = iVar1;
        Abc_TtSwapAdjacent(t,nWords_00,fChange);
        bVar2 = true;
      }
    }
  } while (bVar2);
  return;
}

Assistant:

void Extra_ThreshSortByChow(word * t, int nVars, int * pChow) {
    int i, nWords = Abc_TtWordNum(nVars);
    //sort the variables by Chow in ascending order
    while (1) {
        int fChange = 0;
        for (i = 0; i < nVars - 1; i++) {
            if (pChow[i] >= pChow[i + 1])
                continue;
            ABC_SWAP(int, pChow[i], pChow[i + 1]);
            Abc_TtSwapAdjacent(t, nWords, i);
            fChange = 1;
        }
        if (!fChange)
            return;
    }
}